

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_rela589n.cxx
# Opt level: O3

void newGenerationSort(int64_t **arr,int len)

{
  int iVar1;
  int iVar2;
  int64_t *piVar3;
  int64_t *piVar4;
  uint uVar5;
  long __tmp_2;
  long lVar6;
  long __tmp_1;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  long *plVar11;
  int iVar12;
  long __tmp;
  int len_00;
  ulong uVar13;
  int i;
  int64_t lenA;
  bool bVar14;
  int64_t *restSecond;
  int64_t *restFirst;
  int64_t *selection;
  int64_t *part2;
  int64_t *local_70;
  int64_t *local_68;
  int64_t *local_60;
  ulong local_58;
  int64_t *local_50;
  ulong local_48;
  int64_t **local_40;
  int64_t *local_38;
  
  uVar8 = 8;
  if (len < 8) {
    uVar8 = (ulong)(uint)len;
  }
  if (1 < len) {
    piVar4 = *arr;
    iVar1 = (int)uVar8;
    local_58 = (ulong)(uint)len;
    uVar5 = 2;
    iVar12 = 1;
    do {
      uVar13 = (ulong)uVar5;
      do {
        uVar10 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar10;
        lVar6 = piVar4[uVar13 - 1];
        if (lVar6 <= piVar4[uVar13]) break;
        piVar4[uVar13 - 1] = piVar4[uVar13];
        piVar4[uVar13] = lVar6;
      } while (1 < (int)uVar10);
      uVar5 = uVar5 + 1;
      bVar14 = iVar12 != iVar1 + -1;
      iVar12 = iVar12 + 1;
    } while (bVar14);
    if (8 < len) {
      uVar13 = 0xffffffffffffffff;
      if (-1 < len * 2) {
        uVar13 = (ulong)(uint)(len * 2) * 8;
      }
      local_40 = arr;
      piVar3 = (int64_t *)operator_new__(uVar13);
      local_48 = (ulong)(len - 2);
      piVar3[local_58 - 1] = *piVar4;
      lVar6 = 0;
      do {
        piVar3[local_58 + lVar6] = piVar4[lVar6 + 1];
        lVar6 = lVar6 + 1;
      } while (uVar8 - 1 != lVar6);
      iVar9 = (int)local_58 + (int)lVar6;
      uVar13 = (ulong)((uint)len >> 1) << 3;
      local_60 = piVar3;
      local_68 = (int64_t *)operator_new__(uVar13);
      local_38 = local_68;
      local_70 = (int64_t *)operator_new__(uVar13);
      iVar12 = 0;
      len_00 = 0;
      uVar13 = local_48;
      do {
        lVar6 = piVar4[uVar8];
        if (lVar6 < piVar3[iVar9 - iVar1]) {
          iVar2 = (int)uVar13;
          if (piVar3[iVar2 + iVar1] < lVar6) {
            if ((uVar8 & 1) == 0) {
              lVar7 = (long)iVar12;
              iVar12 = iVar12 + 1;
              local_70[lVar7] = lVar6;
            }
            else {
              lVar7 = (long)len_00;
              len_00 = len_00 + 1;
              local_38[lVar7] = lVar6;
            }
          }
          else {
            piVar3[iVar2] = lVar6;
            lVar7 = piVar3[(long)iVar2 + 1];
            if (lVar7 <= lVar6) {
              plVar11 = piVar3 + iVar2;
              do {
                *plVar11 = lVar7;
                plVar11[1] = lVar6;
                lVar7 = plVar11[2];
                plVar11 = plVar11 + 1;
              } while (lVar7 <= lVar6);
            }
            uVar13 = (ulong)(iVar2 - 1);
          }
        }
        else {
          piVar3[iVar9] = lVar6;
          lVar7 = piVar3[(long)iVar9 + -1];
          if (lVar6 < lVar7) {
            plVar11 = piVar3 + iVar9;
            do {
              plVar11[-1] = lVar6;
              *plVar11 = lVar7;
              lVar7 = plVar11[-2];
              plVar11 = plVar11 + -1;
            } while (lVar6 < lVar7);
          }
          iVar9 = iVar9 + 1;
        }
        uVar8 = uVar8 + 1;
      } while ((int)uVar8 < (int)local_58);
      if (dont_delete != piVar4) {
        operator_delete__(piVar4);
      }
      iVar9 = iVar9 + ~(uint)uVar13;
      lenA = (int64_t)iVar9;
      piVar4 = glue(piVar3 + (long)(int)(uint)uVar13 + 1,lenA,(int64_t *)0x0,0);
      operator_delete__(piVar3);
      local_60 = piVar4;
      newGenerationSort(&local_68,len_00);
      newGenerationSort(&local_70,iVar12);
      if (iVar9 < len_00) {
        glueDelete(&local_60,&local_68,(long)len_00,&local_60,lenA);
        local_50 = local_70;
        lenA = (int64_t)(len_00 + iVar9);
      }
      else {
        glueDelete(&local_50,&local_68,(long)len_00,&local_70,(long)iVar12);
        iVar12 = len_00 + iVar12;
      }
      glueDelete(local_40,&local_60,lenA,&local_50,(long)iVar12);
    }
  }
  return;
}

Assistant:

static void newGenerationSort(SORT_TYPE *&arr, int len) {
  int localCatchUp =
      min(catchUp, len); // потому что мы не можем пытаться вставлять элемент за
                         // границами массива
  insertionSort(arr, 0,
                localCatchUp -
                    1); // для начала сортируем первые localCatchUp элементов

  if (len <=
      localCatchUp) // на случай если это массив на n <= catchUp элементов
    return;         // а также это база рекурсии

  SORT_TYPE *selection =
      new SORT_TYPE[len << 1]; // то же что и new int[len * 2]
  int left = len - 1; // индекс для хранения новых минимальных элементов
  int right = len; // индекс для хранения новых максимальных элементов

  selection[left--] = arr[0];
  for (int i = 1; i < localCatchUp; ++i) {
    selection[right++] = arr[i];
  }

  int restLen = len >> 1;
  SORT_TYPE *restFirst = new SORT_TYPE[restLen];
  SORT_TYPE *restSecond = new SORT_TYPE[restLen];

  int restFirstLen = 0;
  int restSecondLen = 0;

  for (int i = localCatchUp; i < len; ++i) {

    if (selection[right - localCatchUp] <= arr[i]) {
      selection[right] = arr[i];

      for (int j = right; selection[j - 1] > selection[j]; --j)
        swap(selection[j - 1], selection[j]);

      ++right;
      continue;
    }

    if (selection[left + localCatchUp] >= arr[i]) {
      selection[left] = arr[i];

      for (int j = left; selection[j] >= selection[j + 1]; ++j)
        swap(selection[j], selection[j + 1]);

      --left;
      continue;
    }

    if (i & 1) { // i - непарное
      restFirst[restFirstLen++] = arr[i];
    } else {
      restSecond[restSecondLen++] = arr[i];
    }
  }
  safe_delete(arr);

  int selectionLen = right - left - 1; // просто длина нашей выборки
  SORT_TYPE *copy = glue(selection + left + 1, selectionLen, nullptr,
                         0); // копируем все элементы выборки в новый массив

  delete[] selection; // удаляем массив размером 2 * len элементов и
  selection =
      copy; // вместо него используем ровно столько памяти, сколько нужно

  newGenerationSort(restFirst, restFirstLen);
  newGenerationSort(restSecond, restSecondLen);

  SORT_TYPE *part2;
  int part2Len;
  if (selectionLen < restFirstLen) {
    glueDelete(selection, restFirst, restFirstLen, selection,
               selectionLen); // selection += restFirst
    selectionLen += restFirstLen;

    part2 = restSecond;
    part2Len = restSecondLen;
  } else {
    glueDelete(part2, restFirst, restFirstLen, restSecond,
               restSecondLen); // part2 = restFirst + restSecond
    part2Len = restFirstLen + restSecondLen;
  }

  glueDelete(arr, selection, selectionLen, part2, part2Len);
}